

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_originator.c
# Opt level: O0

void olsrv2_originator_set(netaddr *originator)

{
  netaddr *originator_local;
  
  if (originator->_type == '\x02') {
    _set_originator(2,&_originator_v4,originator);
  }
  else if (originator->_type == '\n') {
    _set_originator(10,&_originator_v6,originator);
  }
  return;
}

Assistant:

void
olsrv2_originator_set(const struct netaddr *originator) {
  if (netaddr_get_address_family(originator) == AF_INET) {
    _set_originator(AF_INET, &_originator_v4, originator);
  }
  else if (netaddr_get_address_family(originator) == AF_INET6) {
    _set_originator(AF_INET6, &_originator_v6, originator);
  }
}